

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O1

size_t ssh2_try_send(ssh2_channel *c)

{
  bufchain *ch;
  uint *puVar1;
  ssh2_connection_state *psVar2;
  size_t sVar3;
  PktOut *pPVar4;
  size_t sVar5;
  unsigned_long val;
  BinarySink *bs;
  bufchain *ch_00;
  ulong len;
  ptrlen pl;
  ptrlen pVar6;
  
  psVar2 = c->connlayer;
  if ((c->halfopen == false) && (c->remwindow != 0)) {
    ch = &c->errbuffer;
    do {
      sVar3 = bufchain_size(&c->outbuffer);
      if (sVar3 == 0) {
        sVar3 = bufchain_size(ch);
        if (sVar3 == 0) break;
      }
      sVar3 = bufchain_size(ch);
      ch_00 = ch;
      if (sVar3 == 0) {
        ch_00 = &c->outbuffer;
      }
      pVar6 = bufchain_prefix(ch_00);
      len = (ulong)c->remwindow;
      if (pVar6.len < (ulong)c->remwindow) {
        len = pVar6.len;
      }
      if (c->remmaxpkt <= len) {
        len = (ulong)c->remmaxpkt;
      }
      if (sVar3 == 0) {
        pPVar4 = (*((psVar2->ppl).bpp)->vt->new_pktout)(0x5e);
        bs = pPVar4->binarysink_;
        val = (unsigned_long)c->remoteid;
      }
      else {
        pPVar4 = (*((psVar2->ppl).bpp)->vt->new_pktout)(0x5f);
        bs = pPVar4->binarysink_;
        BinarySink_put_uint32(bs,(ulong)c->remoteid);
        val = 1;
      }
      BinarySink_put_uint32(bs,val);
      pl.len = len;
      pl.ptr = pVar6.ptr;
      BinarySink_put_stringpl(pPVar4->binarysink_,pl);
      pq_base_push(&((psVar2->ppl).out_pq)->pqb,&pPVar4->qnode);
      bufchain_consume(ch_00,len);
      puVar1 = &c->remwindow;
      *puVar1 = *puVar1 - (int)len;
    } while (*puVar1 != 0);
  }
  sVar3 = bufchain_size(&c->outbuffer);
  sVar5 = bufchain_size(&c->errbuffer);
  if ((sVar5 + sVar3 == 0) && (c->pending_eof == true)) {
    ssh2_channel_try_eof(c);
  }
  ssh_sendbuffer_changed((psVar2->ppl).ssh);
  return sVar5 + sVar3;
}

Assistant:

static size_t ssh2_try_send(struct ssh2_channel *c)
{
    struct ssh2_connection_state *s = c->connlayer;
    PktOut *pktout;
    size_t bufsize;

    if (!c->halfopen) {
        while (c->remwindow > 0 &&
               (bufchain_size(&c->outbuffer) > 0 ||
                bufchain_size(&c->errbuffer) > 0)) {
            bufchain *buf = (bufchain_size(&c->errbuffer) > 0 ?
                             &c->errbuffer : &c->outbuffer);

            ptrlen data = bufchain_prefix(buf);
            if (data.len > c->remwindow)
                data.len = c->remwindow;
            if (data.len > c->remmaxpkt)
                data.len = c->remmaxpkt;
            if (buf == &c->errbuffer) {
                pktout = ssh_bpp_new_pktout(
                    s->ppl.bpp, SSH2_MSG_CHANNEL_EXTENDED_DATA);
                put_uint32(pktout, c->remoteid);
                put_uint32(pktout, SSH2_EXTENDED_DATA_STDERR);
            } else {
                pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_CHANNEL_DATA);
                put_uint32(pktout, c->remoteid);
            }
            put_stringpl(pktout, data);
            pq_push(s->ppl.out_pq, pktout);
            bufchain_consume(buf, data.len);
            c->remwindow -= data.len;
        }
    }

    /*
     * After having sent as much data as we can, return the amount
     * still buffered.
     */
    bufsize = bufchain_size(&c->outbuffer) + bufchain_size(&c->errbuffer);

    /*
     * And if there's no data pending but we need to send an EOF, send
     * it.
     */
    if (!bufsize && c->pending_eof)
        ssh2_channel_try_eof(c);

    ssh_sendbuffer_changed(s->ppl.ssh);
    return bufsize;
}